

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIDMap.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMNodeIDMap::DOMNodeIDMap(DOMNodeIDMap *this,XMLSize_t initialSize,DOMDocument *doc)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  RuntimeException *this_00;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  ulong *puVar6;
  
  this->fNumEntries = 0;
  this->fDoc = doc;
  puVar6 = &gPrimes;
  XVar4 = 0;
  while( true ) {
    uVar1 = *puVar6;
    if (initialSize <= uVar1) {
      this->fSizeIndex = XVar4;
      this->fSize = uVar1;
      uVar3 = (ulong)((float)uVar1 * 0.8);
      this->fMaxEntries = (long)((float)uVar1 * 0.8 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
      iVar2 = (*doc[-1].super_DOMNode._vptr_DOMNode[4])(&doc[-1].super_DOMNode,uVar1 << 3);
      this->fTable = (DOMAttr **)CONCAT44(extraout_var,iVar2);
      XVar4 = this->fSize;
      for (XVar5 = 0; XVar4 != XVar5; XVar5 = XVar5 + 1) {
        this->fTable[XVar5] = (DOMAttr *)0x0;
      }
      return;
    }
    if (XVar4 == 6) break;
    XVar4 = XVar4 + 1;
    puVar6 = puVar6 + 1;
  }
  this->fSizeIndex = 5;
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeIDMap.cpp"
             ,0x31,NodeIDMap_GrowErr,(MemoryManager *)this->fDoc[10].super_DOMNode._vptr_DOMNode);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

DOMNodeIDMap::DOMNodeIDMap(XMLSize_t initialSize, DOMDocument *doc)
: fNumEntries(0)
, fDoc(doc)
{
    for (fSizeIndex = 0; gPrimes[fSizeIndex] < initialSize; fSizeIndex++)
    {
        if (gPrimes[fSizeIndex] == 0)
        {
            // We need a bigger size than the largest available one.
            //   Big trouble.
            fSizeIndex--;
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::NodeIDMap_GrowErr, ((DOMDocumentImpl *)fDoc)->getMemoryManager());
        }
    }

    fSize = gPrimes[fSizeIndex];
    fMaxEntries = (XMLSize_t)(float(fSize) * gMaxFill);

    //fTable = new (fDoc) DOMAttr*[fSize];
    fTable = (DOMAttr**) ((DOMDocumentImpl *)fDoc)->allocate(sizeof(DOMAttr*) * fSize);
    XMLSize_t i;
    for (i=0; i<fSize; i++)
        fTable[i] = 0;
}